

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O2

bool __thiscall
ON_OBSOLETE_V5_Annotation::Write(ON_OBSOLETE_V5_Annotation *this,ON_BinaryArchive *file)

{
  int i;
  ON_OBSOLETE_V5_AnnotationText *s;
  V5_eAnnotationType VVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  wchar_t wVar8;
  wchar_t *s_00;
  ON__INT32 OVar9;
  uint local_64;
  ON_wString text_formula;
  ON_2dPointArray points;
  
  iVar5 = ON_BinaryArchive::Archive3dmVersion(file);
  if (iVar5 < 5) {
    bVar3 = ON_BinaryArchive::Write3dmChunkVersion(file,1,0);
    if (!bVar3) {
      return false;
    }
  }
  else {
    bVar3 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,3);
    if (!bVar3) {
      return false;
    }
  }
  bVar3 = ON_BinaryArchive::WriteInt(file,(uint)this->m_type);
  if (((!bVar3) || (bVar3 = ON_BinaryArchive::WriteInt(file,(uint)this->m_textdisplaymode), !bVar3))
     || (bVar3 = ON_BinaryArchive::WritePlane(file,&this->m_plane), !bVar3)) {
    bVar3 = false;
    goto LAB_004bf3db;
  }
  ON_2dPointArray::ON_2dPointArray(&points,&this->m_points);
  local_64 = (uint)this->m_userpositionedtext;
  VVar1 = this->m_type;
  if (VVar1 - 1 < 2) {
    if (points.super_ON_SimpleArray<ON_2dPoint>.m_count == 4) {
      ON_SimpleArray<ON_2dPoint>::AppendNew(&points.super_ON_SimpleArray<ON_2dPoint>);
      ON_2dPoint::Set(points.super_ON_SimpleArray<ON_2dPoint>.m_a + 4,
                      ((points.super_ON_SimpleArray<ON_2dPoint>.m_a)->x +
                      points.super_ON_SimpleArray<ON_2dPoint>.m_a[2].x) * 0.5,
                      points.super_ON_SimpleArray<ON_2dPoint>.m_a[1].y);
      goto LAB_004bf439;
    }
  }
  else {
    if (VVar1 - 4 < 2) {
      if (points.super_ON_SimpleArray<ON_2dPoint>.m_count == 4) {
        ON_SimpleArray<ON_2dPoint>::AppendNew(&points.super_ON_SimpleArray<ON_2dPoint>);
      }
      if (4 < points.super_ON_SimpleArray<ON_2dPoint>.m_count) {
        dVar2 = points.super_ON_SimpleArray<ON_2dPoint>.m_a[2].y;
        points.super_ON_SimpleArray<ON_2dPoint>.m_a[4].x =
             points.super_ON_SimpleArray<ON_2dPoint>.m_a[2].x;
        points.super_ON_SimpleArray<ON_2dPoint>.m_a[4].y = dVar2;
      }
    }
    else if (VVar1 == dtDimAngular) goto LAB_004bf441;
LAB_004bf439:
    local_64 = 0;
  }
LAB_004bf441:
  bVar3 = ON_BinaryArchive::WriteArray(file,&points.super_ON_SimpleArray<ON_2dPoint>);
  if (bVar3) {
    iVar6 = ON_BinaryArchive::Archive3dmVersion(file);
    s = &this->m_usertext;
    if (4 < iVar6) {
      bVar3 = ON_BinaryArchive::WriteString(file,&s->super_ON_wString);
      if (bVar3) goto LAB_004bf559;
      goto LAB_004bf609;
    }
    ON_wString::ON_wString(&text_formula);
    iVar7 = ON_wString::Length(&s->super_ON_wString);
    for (iVar6 = 0; iVar6 < iVar7; iVar6 = iVar6 + 1) {
      wVar8 = ON_wString::operator[](&s->super_ON_wString,iVar6);
      if ((wVar8 == L'\r') ||
         (wVar8 = ON_wString::operator[](&s->super_ON_wString,iVar6), wVar8 == L'\n')) {
        ON_wString::operator+=(&text_formula,L'\r');
        ON_wString::operator+=(&text_formula,L'\n');
        if (iVar6 < iVar7 + -1) {
          i = iVar6 + 1;
          wVar8 = ON_wString::operator[](&s->super_ON_wString,i);
          if ((wVar8 == L'\r') ||
             (wVar8 = ON_wString::operator[](&s->super_ON_wString,i), wVar8 == L'\n')) {
            iVar6 = i;
          }
        }
      }
      else {
        wVar8 = ON_wString::operator[](&s->super_ON_wString,iVar6);
        ON_wString::operator+=(&text_formula,wVar8);
      }
    }
    bVar3 = ON_BinaryArchive::WriteString(file,&text_formula);
    ON_wString::~ON_wString(&text_formula);
    if (!bVar3) goto LAB_004bf609;
LAB_004bf559:
    bVar3 = ON_BinaryArchive::WriteInt(file,local_64);
    if (!bVar3) goto LAB_004bf609;
    VVar1 = this->m_type;
    bVar3 = ON_BinaryArchive::WriteInt(file,this->m_v5_3dm_archive_dimstyle_index);
    if (!bVar3) goto LAB_004bf609;
    bVar3 = ON_BinaryArchive::WriteDouble(file,this->m_textheight);
    if (bVar3 && 4 < iVar5) {
      bVar3 = ON_BinaryArchive::WriteInt(file,this->m_justification);
      if ((!bVar3) || (bVar3 = ON_BinaryArchive::WriteBool(file,this->m_annotative_scale), !bVar3))
      goto LAB_004bf609;
      s_00 = TextFormula(this);
      ON_wString::ON_wString(&text_formula,s_00);
      bVar3 = ON_BinaryArchive::WriteString(file,&text_formula);
      if (bVar3) {
        if (VVar1 == dtTextBlock) {
          OVar9 = this->m_v5_3dm_archive_dimstyle_index;
        }
        else {
          OVar9 = -1;
        }
        bVar3 = ON_BinaryArchive::WriteInt(file,OVar9);
        if (!bVar3) goto LAB_004bf639;
        if (VVar1 == dtTextBlock) {
          OVar9 = -1;
        }
        else {
          OVar9 = this->m_v5_3dm_archive_dimstyle_index;
        }
        bVar3 = ON_BinaryArchive::WriteInt(file,OVar9);
      }
      else {
LAB_004bf639:
        bVar3 = false;
      }
      ON_wString::~ON_wString(&text_formula);
    }
  }
  else {
LAB_004bf609:
    bVar3 = false;
  }
  ON_SimpleArray<ON_2dPoint>::~ON_SimpleArray(&points.super_ON_SimpleArray<ON_2dPoint>);
LAB_004bf3db:
  if (4 < iVar5) {
    bVar4 = ON_BinaryArchive::EndWrite3dmChunk(file);
    bVar3 = (bool)(bVar3 & bVar4);
  }
  return bVar3;
}

Assistant:

bool ON_OBSOLETE_V5_Annotation::Write( ON_BinaryArchive& file ) const
{
  //int i;
  unsigned int ui;
  bool rc = false;
  bool bInChunk = (file.Archive3dmVersion() >= 5 );
  if ( bInChunk )
  {
    // 18 October 2007 Dale Lear
    //   I modified this code so that V5 files can add
    //   information in ON_OBSOLETE_V5_Annotation chunks without
    //   breaking past and future file IO.
    //   The opennurbs version number before this change was
    //   20071017*.  I changed the version to 20071018* when
    //   I checked in this IO change.  The reason I can get
    //   away with this is that nobody except developers has
    //   a copy of V5 Rhino.
    // 28 Aug, 2010 - Lowell - changed minor version 0->1 to write
    //   annotative scale flag
    // 24 September 2010 Dale Lear 
    //   I incremented chunk version to 1.2 and wrote the TextFormula() string.
    rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,3);
    if (!rc)
      return false;
  }
  else
  {
    // For archives with opennurbs version < 200710180
    // The code before version 200710180 does not properly
    // handle new additions to the ON_OBSOLETE_V5_Annotation chunk.  
    rc = file.Write3dmChunkVersion( 1, 0 );
  }

  while(rc)
  {
    ui = static_cast<unsigned char>(m_type);
    rc = file.WriteInt(ui);
    if ( !rc) break;

    ui = (unsigned int)m_textdisplaymode;    
    rc = file.WriteInt(ui);
    if ( !rc) break;

    // June 17, 2010 - Lowell - Added adjustment to position text
    // a little better in pre-v5 files.
    // There's no adjustment for right/left justify because we don't
    // know the width of the text here
    // This doesn't change the size or position of any fields being
    // written, but just adjusts the plane to tune up the alignment

    // 16 Nov, 2011 - Lowell - Change text to bottom left justified for pre-v5 files rr94270
    // This stuff is moved to CRhinoDoc::Write3DMHelper() so it will help with other file
    // formats too
    //ON_Plane plane = m_plane;
    //if(file.Archive3dmVersion() <= 4 && m_type == ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtTextBlock)
    //{
    //  double height = m_textheight;
    //  int lines = CountTextLines(m_usertext);
    //  double linefeed = ON_Font::m_default_linefeed_ratio;

    //  if(m_justification & tjBottom)
    //  {
    //    if(lines > 1)
    //    {
    //      ON_3dPoint p = plane.PointAt(0.0, -height * (lines-1) * linefeed);
    //      plane.SetOrigin(p);
    //    }
    //  }
    //  else if(m_justification & tjMiddle)
    //  {
    //    double h = height * (lines-1) * linefeed + height;
    //    ON_3dPoint p = plane.PointAt(0.0, h * 0.5);
    //    plane.SetOrigin(p);
    //  }
    //  else if(m_justification & tjTop)
    //  {
    //    ON_3dPoint p = plane.PointAt(0.0, -height);
    //    plane.SetOrigin(p);
    //  }
    //}
  
    rc = file.WritePlane(m_plane);
    if ( !rc) break;

    ON_2dPointArray points = m_points;
    int bUserPositionedText = m_userpositionedtext?1:0;
    switch( m_type )
    {
    case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAligned:
    case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear:
      if ( 4 == points.Count() )
      {
        // so old versions will read enough points.
        points.AppendNew();
        points[4].Set(0.5*(points[0].x + points[2].x),points[1].y);
        bUserPositionedText = false;
      }
      break;

    case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAngular:
      //user positioned text is supported.
      break;

    case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimRadius:
    case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter:
      // 9 August 2005 Dale Lear - radial dimensions do
      // not support user positioned text.  The never have
      // in Rhino, but the old files had 5 points in them.
      if ( 4 == points.Count() )
      {
        // so old versions will read enough points.
        points.AppendNew();
      }
      if ( points.Count() >= 5 )
      {
        points[4] = points[2];
      }
      bUserPositionedText = false;
      break;

    default:
      bUserPositionedText = false;
      break;
    }
    
    rc = file.WriteArray( points);
    if ( !rc) break;
    
    // June 17, 2010 - Lowell - Added support for writing word-wrapped text
    // to pre-v5 files with hard returns in place of wrapping markers
    rc = ( file.Archive3dmVersion() <= 4 )
       ? WriteAnnotation2UserText_V4(file,m_usertext)
       : WriteAnnotation2UserText_V5(file,m_usertext);
    if ( !rc) break;
    // 7-9-03 lw removed extra text string getting written
    
    rc = file.WriteInt( bUserPositionedText );
    if ( !rc) break;
    

    const bool bIsText = IsText();
    //rc = file.Write3dmReferencedComponentIndex(
    //  bIsText ? ON_ModelComponent::Type::TextStyle : ON_ModelComponent::Type::DimStyle, m_dimstyle_index );
    rc = file.WriteInt(m_v5_3dm_archive_dimstyle_index);
    if ( !rc) break;

    rc = file.WriteDouble( m_textheight);
    if ( !rc) break;

    if ( !bInChunk )
      break;

    // NOTE WELL - NEVER change the code in this function
    //             above this comment.  If you do, you will
    //             break reading and writing V4 files.
    //             Ask Dale Lear if you have any questions.

    // 18 October 2007 - Dale Lear added m_justification IO
    rc = file.WriteInt(m_justification);
    if ( !rc) 
      break;

    // 28 Aug 2010 - Lowell - Added flag for whether text gets scaled in modelspace
    rc = file.WriteBool(m_annotative_scale);
    if(!rc)
      break;

    // 24 September 2010 Dale Lear 
    //   I incremented chunk version to 1.2
    ON_wString text_formula = TextFormula();
    rc = file.WriteString(text_formula);
    if(!rc)
      break;

    // To write more ON_OBSOLETE_V5_Annotation fields, increment the minor version
    // number and write the new information here.

    // September 2015 Dale Lear
    //   I incremented chunk version to 1.3
    //   and separated text style and dim style
    //rc = file.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::TextStyle, bIsText ? m_dimstyle_index : -1 );
    //if ( !rc) break;
    //rc = file.Write3dmReferencedComponentIndex( ON_ModelComponent::Type::DimStyle, bIsText ? -1 : m_dimstyle_index );
    //if ( !rc) break;
    rc = file.WriteInt( bIsText ? m_v5_3dm_archive_dimstyle_index : -1 );
    if ( !rc) break;
    rc = file.WriteInt( bIsText ? -1 : m_v5_3dm_archive_dimstyle_index );
    if ( !rc) break;

    // Finished writing ON_OBSOLETE_V5_Annotation information
    break;
  }

  if ( bInChunk )
  {
    if ( !file.EndWrite3dmChunk() )
      rc = false;
  }

  return rc;
}